

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanDynamicHeap.cpp
# Opt level: O3

VulkanDynamicAllocation * __thiscall
Diligent::VulkanDynamicHeap::Allocate
          (VulkanDynamicAllocation *__return_storage_ptr__,VulkanDynamicHeap *this,
          Uint32 SizeInBytes,Uint32 Alignment)

{
  pointer *ppAVar1;
  iterator iVar2;
  OffsetType OVar3;
  OffsetType OVar4;
  undefined4 in_register_0000000c;
  char (*Args_1) [14];
  char (*Args_1_00) [80];
  uint uVar5;
  char (*in_R8) [23];
  size_t sVar6;
  OffsetType OVar7;
  uint uVar8;
  ulong uVar9;
  MasterBlock MVar10;
  string msg;
  MasterBlock MasterBlock;
  Uint32 local_74;
  string local_70;
  size_t local_50;
  MasterBlock local_48;
  ulong local_38;
  
  Args_1 = (char (*) [14])CONCAT44(in_register_0000000c,Alignment);
  local_74 = Alignment;
  if (Alignment == 0) {
    FormatString<char[26],char[14]>
              (&local_70,(Diligent *)"Debug expression failed:\n",(char (*) [26])0x761f07,Args_1);
    DebugAssertionFailed
              (local_70._M_dataplus._M_p,"Allocate",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanDynamicHeap.cpp"
               ,0xe1);
    if ((MasterBlock *)local_70._M_dataplus._M_p != (MasterBlock *)&local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    Args_1 = (char (*) [14])(ulong)local_74;
    if (local_74 != 0) goto LAB_002705e9;
LAB_002705f0:
    FormatString<char[12],unsigned_int,char[21]>
              (&local_70,(Diligent *)"Alignment (",(char (*) [12])&local_74,
               (uint *)") must be power of 2",(char (*) [21])in_R8);
    DebugAssertionFailed
              (local_70._M_dataplus._M_p,"Allocate",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanDynamicHeap.cpp"
               ,0xe2);
    if ((MasterBlock *)local_70._M_dataplus._M_p != (MasterBlock *)&local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  }
  else {
LAB_002705e9:
    if (((uint)Args_1 & (uint)Args_1 - 1) != 0) goto LAB_002705f0;
  }
  uVar8 = this->m_MasterBlockSize;
  local_50 = (size_t)SizeInBytes;
  if (uVar8 >> 1 < SizeInBytes) {
    MVar10 = VulkanDynamicMemoryManager::AllocateMasterBlock
                       (this->m_GlobalDynamicMemMgr,local_50,(ulong)local_74);
    uVar9 = MVar10.Size;
    OVar3 = MVar10.UnalignedOffset;
    local_48 = MVar10;
    if (OVar3 == 0xffffffffffffffff) {
      sVar6 = 0xffffffffffffffff;
      uVar9 = 0;
    }
    else {
      local_38 = (ulong)local_74;
      Args_1_00 = (char (*) [80])(local_38 ^ local_38 - 1);
      if (Args_1_00 <= (char (*) [80])(local_38 - 1)) {
        FormatString<char[12],unsigned_long,char[23]>
                  (&local_70,(Diligent *)"Alignment (",(char (*) [12])&local_38,
                   (unsigned_long *)") must be a power of 2",in_R8);
        Args_1_00 = (char (*) [80])0x34;
        DebugAssertionFailed
                  (local_70._M_dataplus._M_p,"AlignUp",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/Align.hpp"
                   ,0x34);
        if ((MasterBlock *)local_70._M_dataplus._M_p != (MasterBlock *)&local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
      }
      sVar6 = -local_38 & (local_38 + OVar3) - 1;
      if (uVar9 < (local_50 + sVar6) - OVar3) {
        FormatString<char[26],char[80]>
                  (&local_70,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])
                   "MasterBlock.Size >= SizeInBytes + (AlignedOffset - MasterBlock.UnalignedOffset)"
                   ,Args_1_00);
        DebugAssertionFailed
                  (local_70._M_dataplus._M_p,"Allocate",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanDynamicHeap.cpp"
                   ,0xee);
        if ((MasterBlock *)local_70._M_dataplus._M_p != (MasterBlock *)&local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
      }
      this->m_CurrAllocatedSize = this->m_CurrAllocatedSize + (int)MVar10.Size;
      iVar2._M_current =
           (this->m_MasterBlocks).
           super__Vector_base<Diligent::VariableSizeAllocationsManager::Allocation,_std::allocator<Diligent::VariableSizeAllocationsManager::Allocation>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (this->m_MasterBlocks).
          super__Vector_base<Diligent::VariableSizeAllocationsManager::Allocation,_std::allocator<Diligent::VariableSizeAllocationsManager::Allocation>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<Diligent::VariableSizeAllocationsManager::Allocation,std::allocator<Diligent::VariableSizeAllocationsManager::Allocation>>
        ::_M_realloc_insert<Diligent::VariableSizeAllocationsManager::Allocation&>
                  ((vector<Diligent::VariableSizeAllocationsManager::Allocation,std::allocator<Diligent::VariableSizeAllocationsManager::Allocation>>
                    *)&this->m_MasterBlocks,iVar2,&local_48);
      }
      else {
        (iVar2._M_current)->UnalignedOffset = local_48.UnalignedOffset;
        (iVar2._M_current)->Size = local_48.Size;
        ppAVar1 = &(this->m_MasterBlocks).
                   super__Vector_base<Diligent::VariableSizeAllocationsManager::Allocation,_std::allocator<Diligent::VariableSizeAllocationsManager::Allocation>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppAVar1 = *ppAVar1 + 1;
      }
    }
  }
  else {
    OVar4 = this->m_CurrOffset;
    if (OVar4 == 0xffffffffffffffff) {
LAB_00270840:
      local_70._0_16_ =
           VulkanDynamicMemoryManager::AllocateMasterBlock
                     (this->m_GlobalDynamicMemMgr,(ulong)uVar8,0);
      OVar3 = local_70._M_dataplus._M_p;
      if (OVar3 != 0xffffffffffffffff) {
        this->m_CurrOffset = OVar3;
        this->m_CurrAllocatedSize = this->m_CurrAllocatedSize + (Uint32)local_70._M_string_length;
        this->m_AvailableSize = (Uint32)local_70._M_string_length;
        iVar2._M_current =
             (this->m_MasterBlocks).
             super__Vector_base<Diligent::VariableSizeAllocationsManager::Allocation,_std::allocator<Diligent::VariableSizeAllocationsManager::Allocation>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (this->m_MasterBlocks).
            super__Vector_base<Diligent::VariableSizeAllocationsManager::Allocation,_std::allocator<Diligent::VariableSizeAllocationsManager::Allocation>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<Diligent::VariableSizeAllocationsManager::Allocation,std::allocator<Diligent::VariableSizeAllocationsManager::Allocation>>
          ::_M_realloc_insert<Diligent::VariableSizeAllocationsManager::Allocation&>
                    ((vector<Diligent::VariableSizeAllocationsManager::Allocation,std::allocator<Diligent::VariableSizeAllocationsManager::Allocation>>
                      *)&this->m_MasterBlocks,iVar2,(Allocation *)&local_70);
        }
        else {
          (iVar2._M_current)->UnalignedOffset = OVar3;
          (iVar2._M_current)->Size = local_70._M_string_length;
          ppAVar1 = &(this->m_MasterBlocks).
                     super__Vector_base<Diligent::VariableSizeAllocationsManager::Allocation,_std::allocator<Diligent::VariableSizeAllocationsManager::Allocation>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppAVar1 = *ppAVar1 + 1;
        }
      }
      OVar7 = this->m_CurrOffset;
    }
    else {
      uVar9 = (ulong)local_74;
      local_48.UnalignedOffset = uVar9;
      OVar7 = OVar4;
      if ((uVar9 ^ uVar9 - 1) <= uVar9 - 1) {
        FormatString<char[12],unsigned_long,char[23]>
                  (&local_70,(Diligent *)"Alignment (",(char (*) [12])&local_48,
                   (unsigned_long *)") must be a power of 2",in_R8);
        DebugAssertionFailed
                  (local_70._M_dataplus._M_p,"AlignUp",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/Align.hpp"
                   ,0x34);
        if ((MasterBlock *)local_70._M_dataplus._M_p != (MasterBlock *)&local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        OVar7 = this->m_CurrOffset;
        uVar9 = local_48.UnalignedOffset;
      }
      if ((ulong)this->m_AvailableSize < (local_50 - OVar7) + (-uVar9 & (OVar4 + uVar9) - 1)) {
        uVar8 = this->m_MasterBlockSize;
        goto LAB_00270840;
      }
    }
    if (OVar7 == 0xffffffffffffffff) goto LAB_00270a33;
    local_48.UnalignedOffset = (OffsetType)local_74;
    OVar4 = OVar7;
    uVar9 = local_48.UnalignedOffset;
    if ((local_48.UnalignedOffset ^ local_48.UnalignedOffset - 1) <= local_48.UnalignedOffset - 1) {
      FormatString<char[12],unsigned_long,char[23]>
                (&local_70,(Diligent *)"Alignment (",(char (*) [12])&local_48,
                 (unsigned_long *)") must be a power of 2",in_R8);
      DebugAssertionFailed
                (local_70._M_dataplus._M_p,"AlignUp",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/Align.hpp"
                 ,0x34);
      if ((MasterBlock *)local_70._M_dataplus._M_p != (MasterBlock *)&local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      OVar4 = this->m_CurrOffset;
      uVar9 = local_48.UnalignedOffset;
    }
    sVar6 = -uVar9 & (uVar9 + OVar7) - 1;
    uVar9 = (sVar6 - OVar4) + local_50;
    if (this->m_AvailableSize < uVar9) goto LAB_00270a33;
    this->m_AvailableSize = this->m_AvailableSize - (int)uVar9;
    this->m_CurrOffset = local_50 + sVar6;
  }
  if (sVar6 != 0xffffffffffffffff) {
    uVar8 = (int)uVar9 + this->m_CurrAlignedSize;
    this->m_CurrAlignedSize = uVar8;
    uVar5 = SizeInBytes + this->m_CurrUsedSize;
    this->m_CurrUsedSize = uVar5;
    if (uVar8 < this->m_PeakAlignedSize) {
      uVar8 = this->m_PeakAlignedSize;
    }
    if (uVar5 < this->m_PeakUsedSize) {
      uVar5 = this->m_PeakUsedSize;
    }
    this->m_PeakAlignedSize = uVar8;
    this->m_PeakUsedSize = uVar5;
    uVar8 = this->m_CurrAllocatedSize;
    if (this->m_CurrAllocatedSize < this->m_PeakAllocatedSize) {
      uVar8 = this->m_PeakAllocatedSize;
    }
    this->m_PeakAllocatedSize = uVar8;
    if (((uint)sVar6 & local_74 - 1) != 0) {
      FormatString<char[26],char[39]>
                (&local_70,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"(AlignedOffset & (Alignment - 1)) == 0",(char (*) [39])(ulong)uVar8
                );
      DebugAssertionFailed
                (local_70._M_dataplus._M_p,"Allocate",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanDynamicHeap.cpp"
                 ,0x118);
      if ((MasterBlock *)local_70._M_dataplus._M_p != (MasterBlock *)&local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
    }
    __return_storage_ptr__->pDynamicMemMgr = this->m_GlobalDynamicMemMgr;
    __return_storage_ptr__->AlignedOffset = sVar6;
    __return_storage_ptr__->Size = local_50;
    __return_storage_ptr__->dvpFrameNumber = 0;
    return __return_storage_ptr__;
  }
LAB_00270a33:
  __return_storage_ptr__->Size = 0;
  __return_storage_ptr__->dvpFrameNumber = 0;
  __return_storage_ptr__->pDynamicMemMgr = (VulkanDynamicMemoryManager *)0x0;
  __return_storage_ptr__->AlignedOffset = 0;
  return __return_storage_ptr__;
}

Assistant:

VulkanDynamicAllocation VulkanDynamicHeap::Allocate(Uint32 SizeInBytes, Uint32 Alignment)
{
    VERIFY_EXPR(Alignment > 0);
    VERIFY(IsPowerOfTwo(Alignment), "Alignment (", Alignment, ") must be power of 2");

    auto       AlignedOffset = InvalidOffset;
    OffsetType AlignedSize   = 0;
    if (SizeInBytes > m_MasterBlockSize / 2)
    {
        // Allocate directly from the memory manager
        auto MasterBlock = m_GlobalDynamicMemMgr.AllocateMasterBlock(SizeInBytes, Alignment);
        if (MasterBlock.IsValid())
        {
            AlignedOffset = AlignUp(MasterBlock.UnalignedOffset, size_t{Alignment});
            AlignedSize   = MasterBlock.Size;
            VERIFY_EXPR(MasterBlock.Size >= SizeInBytes + (AlignedOffset - MasterBlock.UnalignedOffset));
            m_CurrAllocatedSize += static_cast<Uint32>(MasterBlock.Size);
            m_MasterBlocks.emplace_back(MasterBlock);
        }
    }
    else
    {
        if (m_CurrOffset == InvalidOffset || SizeInBytes + (AlignUp(m_CurrOffset, size_t{Alignment}) - m_CurrOffset) > m_AvailableSize)
        {
            auto MasterBlock = m_GlobalDynamicMemMgr.AllocateMasterBlock(m_MasterBlockSize, 0);
            if (MasterBlock.IsValid())
            {
                m_CurrOffset = MasterBlock.UnalignedOffset;
                m_CurrAllocatedSize += static_cast<Uint32>(MasterBlock.Size);
                m_AvailableSize = static_cast<Uint32>(MasterBlock.Size);
                m_MasterBlocks.emplace_back(MasterBlock);
            }
        }

        if (m_CurrOffset != InvalidOffset)
        {
            AlignedOffset = AlignUp(m_CurrOffset, size_t{Alignment});
            AlignedSize   = SizeInBytes + (AlignedOffset - m_CurrOffset);
            if (AlignedSize <= m_AvailableSize)
            {
                m_AvailableSize -= static_cast<Uint32>(AlignedSize);
                m_CurrOffset += static_cast<Uint32>(AlignedSize);
            }
            else
                AlignedOffset = InvalidOffset;
        }
    }

    // Every device context uses its own dynamic heap, so there is no need to lock
    if (AlignedOffset != InvalidOffset)
    {
        m_CurrAlignedSize += static_cast<Uint32>(AlignedSize);
        m_CurrUsedSize += SizeInBytes;
        m_PeakAlignedSize   = std::max(m_PeakAlignedSize, m_CurrAlignedSize);
        m_PeakUsedSize      = std::max(m_PeakUsedSize, m_CurrUsedSize);
        m_PeakAllocatedSize = std::max(m_PeakAllocatedSize, m_CurrAllocatedSize);

        VERIFY_EXPR((AlignedOffset & (Alignment - 1)) == 0);
        return VulkanDynamicAllocation{m_GlobalDynamicMemMgr, AlignedOffset, SizeInBytes};
    }
    else
        return VulkanDynamicAllocation{};
}